

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctx.c
# Opt level: O3

_Bool chirc_ctx_get_or_create_channel(chirc_ctx_t *ctx,char *channelname,chirc_channel_t **channel)

{
  UT_hash_bucket *pUVar1;
  byte bVar2;
  int *piVar3;
  UT_hash_handle *pUVar4;
  UT_hash_handle *pUVar5;
  undefined1 uVar6;
  int iVar7;
  size_t sVar8;
  byte *pbVar9;
  sds pcVar10;
  UT_hash_table *pUVar11;
  UT_hash_bucket *pUVar12;
  ulong uVar13;
  uint uVar14;
  UT_hash_handle *pUVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  int *piVar19;
  uint uVar20;
  uint uVar21;
  chirc_channel_t *pcVar22;
  
  sVar8 = strlen(channelname);
  *channel = (chirc_channel_t *)0x0;
  if (ctx->channels != (chirc_channel_t *)0x0) {
    uVar17 = (uint)sVar8;
    pbVar9 = (byte *)channelname;
    if (uVar17 < 0xc) {
      uVar14 = 0xfeedbeef;
      uVar18 = 0x9e3779b9;
      uVar16 = 0x9e3779b9;
      uVar20 = uVar17;
    }
    else {
      uVar16 = 0x9e3779b9;
      uVar14 = 0xfeedbeef;
      uVar18 = 0x9e3779b9;
      uVar13 = sVar8 & 0xffffffff;
      do {
        uVar14 = uVar14 + *(int *)(pbVar9 + 8);
        uVar20 = uVar14 >> 0xd ^
                 ((uVar16 + *(int *)pbVar9) - (uVar18 + *(int *)(pbVar9 + 4))) - uVar14;
        uVar18 = uVar20 << 8 ^ ((uVar18 + *(int *)(pbVar9 + 4)) - uVar14) - uVar20;
        uVar16 = uVar18 >> 0xd ^ (uVar14 - uVar20) - uVar18;
        uVar20 = uVar16 >> 0xc ^ (uVar20 - uVar18) - uVar16;
        uVar14 = uVar20 << 0x10 ^ (uVar18 - uVar16) - uVar20;
        uVar21 = uVar14 >> 5 ^ (uVar16 - uVar20) - uVar14;
        uVar16 = uVar21 >> 3 ^ (uVar20 - uVar14) - uVar21;
        uVar18 = uVar16 << 10 ^ (uVar14 - uVar21) - uVar16;
        uVar14 = uVar18 >> 0xf ^ (uVar21 - uVar16) - uVar18;
        pbVar9 = pbVar9 + 0xc;
        uVar20 = (int)uVar13 - 0xc;
        uVar13 = (ulong)uVar20;
      } while (0xb < uVar20);
    }
    uVar14 = uVar14 + uVar17;
    switch(uVar20) {
    case 0xb:
      uVar14 = (uint)pbVar9[10] * 0x1000000 + uVar14;
    case 10:
      uVar14 = (uint)pbVar9[9] * 0x10000 + uVar14;
    case 9:
      uVar14 = (uint)pbVar9[8] * 0x100 + uVar14;
    case 8:
      uVar18 = (uint)pbVar9[7] * 0x1000000 + uVar18;
    case 7:
      uVar18 = (uint)pbVar9[6] * 0x10000 + uVar18;
    case 6:
      uVar18 = (uint)pbVar9[5] * 0x100 + uVar18;
    case 5:
      uVar18 = pbVar9[4] + uVar18;
    case 4:
      uVar16 = (uint)pbVar9[3] * 0x1000000 + uVar16;
    case 3:
      uVar16 = (uint)pbVar9[2] * 0x10000 + uVar16;
    case 2:
      uVar16 = (uint)pbVar9[1] * 0x100 + uVar16;
    case 1:
      uVar16 = *pbVar9 + uVar16;
    }
    if (ctx->channels != (chirc_channel_t *)0x0) {
      uVar20 = uVar14 >> 0xd ^ (uVar16 - uVar18) - uVar14;
      uVar18 = uVar20 << 8 ^ (uVar18 - uVar14) - uVar20;
      uVar16 = uVar18 >> 0xd ^ (uVar14 - uVar20) - uVar18;
      uVar20 = uVar16 >> 0xc ^ (uVar20 - uVar18) - uVar16;
      uVar18 = uVar20 << 0x10 ^ (uVar18 - uVar16) - uVar20;
      uVar14 = uVar18 >> 5 ^ (uVar16 - uVar20) - uVar18;
      uVar20 = uVar14 >> 3 ^ (uVar20 - uVar18) - uVar14;
      uVar16 = uVar20 << 10 ^ (uVar18 - uVar14) - uVar20;
      uVar20 = uVar16 >> 0xf ^ uVar14 - (uVar20 + uVar16);
      pUVar11 = (ctx->channels->hh).tbl;
      pUVar15 = pUVar11->buckets[pUVar11->num_buckets - 1 & uVar20].hh_head;
      if (pUVar15 != (UT_hash_handle *)0x0) {
        pcVar22 = (chirc_channel_t *)((long)pUVar15 - pUVar11->hho);
        *channel = pcVar22;
        while( true ) {
          if ((((pcVar22->hh).hashv == uVar20) && ((pcVar22->hh).keylen == uVar17)) &&
             (iVar7 = bcmp((pcVar22->hh).key,channelname,sVar8 & 0xffffffff), iVar7 == 0)) {
            return false;
          }
          pUVar15 = (pcVar22->hh).hh_next;
          if (pUVar15 == (UT_hash_handle *)0x0) break;
          pcVar22 = (chirc_channel_t *)((long)pUVar15 - ((ctx->channels->hh).tbl)->hho);
          *channel = pcVar22;
        }
      }
    }
  }
  pcVar22 = (chirc_channel_t *)malloc(0x60);
  *channel = pcVar22;
  chirc_channel_init(pcVar22);
  pcVar10 = sdsnew(channelname);
  (*channel)->name = pcVar10;
  pcVar22 = *channel;
  piVar3 = (int *)pcVar22->name;
  bVar2 = *(byte *)((long)piVar3 + -1);
  uVar20 = 0x9e3779b9;
  uVar17 = 0xfeedbeef;
  piVar19 = piVar3;
  switch(bVar2 & 7) {
  case 0:
    uVar13 = (ulong)(bVar2 >> 3);
    break;
  case 1:
    uVar13 = (ulong)*(byte *)((long)piVar3 + -3);
    break;
  case 2:
    uVar13 = (ulong)*(ushort *)((long)piVar3 + -5);
    break;
  case 3:
    uVar13 = (ulong)*(uint *)((long)piVar3 + -9);
    break;
  case 4:
    uVar13 = *(ulong *)((long)piVar3 + -0x11);
    break;
  default:
    uVar16 = 0;
    goto LAB_00104367;
  }
  uVar16 = (uint)uVar13;
  if (uVar16 < 0xc) {
LAB_00104367:
    uVar14 = 0x9e3779b9;
  }
  else {
    uVar17 = 0xfeedbeef;
    uVar14 = 0x9e3779b9;
    uVar20 = 0x9e3779b9;
    do {
      uVar17 = uVar17 + piVar19[2];
      uVar18 = uVar17 >> 0xd ^ ((uVar20 + *piVar19) - (uVar14 + piVar19[1])) - uVar17;
      uVar20 = uVar18 << 8 ^ ((uVar14 + piVar19[1]) - uVar17) - uVar18;
      uVar16 = uVar20 >> 0xd ^ (uVar17 - uVar18) - uVar20;
      uVar17 = uVar16 >> 0xc ^ (uVar18 - uVar20) - uVar16;
      uVar14 = uVar17 << 0x10 ^ (uVar20 - uVar16) - uVar17;
      uVar16 = uVar14 >> 5 ^ (uVar16 - uVar17) - uVar14;
      uVar20 = uVar16 >> 3 ^ (uVar17 - uVar14) - uVar16;
      uVar14 = uVar20 << 10 ^ (uVar14 - uVar16) - uVar20;
      uVar17 = uVar14 >> 0xf ^ (uVar16 - uVar20) - uVar14;
      piVar19 = piVar19 + 3;
      uVar16 = (int)uVar13 - 0xc;
      uVar13 = (ulong)uVar16;
    } while (0xb < uVar16);
  }
  switch(bVar2 & 7) {
  case 0:
    uVar18 = (uint)(bVar2 >> 3);
    break;
  case 1:
    uVar18 = (uint)*(byte *)((long)piVar3 + -3);
    break;
  case 2:
    uVar18 = (uint)*(ushort *)((long)piVar3 + -5);
    break;
  case 3:
    uVar18 = *(uint *)((long)piVar3 + -9);
    break;
  case 4:
    uVar18 = (uint)*(undefined8 *)((long)piVar3 + -0x11);
    break;
  default:
    uVar18 = 0;
  }
  uVar17 = uVar17 + uVar18;
  if (uVar16 - 1 < 0xb) {
    uVar6 = (*(code *)(&DAT_0010a184 + *(int *)(&DAT_0010a184 + (ulong)(uVar16 - 1) * 4)))(piVar19);
    return (_Bool)uVar6;
  }
  uVar16 = uVar17 >> 0xd ^ (uVar20 - uVar17) - uVar14;
  uVar20 = uVar16 << 8 ^ (uVar14 - uVar17) - uVar16;
  uVar14 = uVar20 >> 0xd ^ (uVar17 - uVar16) - uVar20;
  uVar17 = uVar14 >> 0xc ^ (uVar16 - uVar20) - uVar14;
  uVar16 = uVar17 << 0x10 ^ (uVar20 - uVar14) - uVar17;
  uVar20 = uVar16 >> 5 ^ (uVar14 - uVar17) - uVar16;
  uVar14 = uVar20 >> 3 ^ (uVar17 - uVar16) - uVar20;
  uVar17 = uVar14 << 10 ^ (uVar16 - uVar20) - uVar14;
  uVar17 = uVar17 >> 0xf ^ uVar20 - (uVar14 + uVar17);
  (pcVar22->hh).hashv = uVar17;
  (pcVar22->hh).key = piVar3;
  pcVar22 = *channel;
  pcVar10 = pcVar22->name;
  switch(pcVar10[-1] & 7) {
  case 0:
    uVar20 = (uint)((byte)pcVar10[-1] >> 3);
    break;
  case 1:
    uVar20 = (uint)(byte)pcVar10[-3];
    break;
  case 2:
    uVar20 = (uint)*(ushort *)(pcVar10 + -5);
    break;
  case 3:
    uVar20 = *(uint *)(pcVar10 + -9);
    break;
  case 4:
    uVar20 = (uint)*(undefined8 *)(pcVar10 + -0x11);
    break;
  default:
    uVar20 = 0;
  }
  (pcVar22->hh).keylen = uVar20;
  if (ctx->channels == (chirc_channel_t *)0x0) {
    (pcVar22->hh).next = (void *)0x0;
    ((*channel)->hh).prev = (void *)0x0;
    pUVar11 = (UT_hash_table *)malloc(0x40);
    ((*channel)->hh).tbl = pUVar11;
    pUVar11 = ((*channel)->hh).tbl;
    if (pUVar11 == (UT_hash_table *)0x0) goto LAB_0010482e;
    pUVar11->ineff_expands = 0;
    pUVar11->noexpand = 0;
    *(undefined8 *)&pUVar11->signature = 0;
    pUVar11->hho = 0;
    pUVar11->ideal_chain_maxlen = 0;
    pUVar11->nonideal_items = 0;
    *(undefined8 *)&pUVar11->num_items = 0;
    pUVar11->tail = (UT_hash_handle *)0x0;
    pUVar11->buckets = (UT_hash_bucket *)0x0;
    pUVar11->num_buckets = 0;
    pUVar11->log2_num_buckets = 0;
    (((*channel)->hh).tbl)->tail = &(*channel)->hh;
    pUVar11 = ((*channel)->hh).tbl;
    pUVar11->num_buckets = 0x20;
    pUVar11->log2_num_buckets = 5;
    pUVar11->hho = 0x28;
    pUVar12 = (UT_hash_bucket *)malloc(0x200);
    pUVar11->buckets = pUVar12;
    pUVar11 = ((*channel)->hh).tbl;
    pUVar11->signature = 0xa0111fe1;
    pUVar12 = pUVar11->buckets;
    if (pUVar12 == (UT_hash_bucket *)0x0) goto LAB_0010482e;
    memset(pUVar12,0,0x200);
    pcVar22 = *channel;
    ctx->channels = pcVar22;
    pUVar11 = (pcVar22->hh).tbl;
  }
  else {
    pUVar11 = (ctx->channels->hh).tbl;
    (pcVar22->hh).tbl = pUVar11;
    ((*channel)->hh).next = (void *)0x0;
    pUVar15 = pUVar11->tail;
    ((*channel)->hh).prev = (void *)((long)pUVar15 - pUVar11->hho);
    pcVar22 = *channel;
    pUVar15->next = pcVar22;
    pUVar11->tail = &pcVar22->hh;
    pcVar22 = *channel;
  }
  pUVar11->num_items = pUVar11->num_items + 1;
  uVar17 = pUVar11->num_buckets - 1 & uVar17;
  pUVar12 = pUVar11->buckets;
  uVar20 = pUVar12[uVar17].count + 1;
  pUVar12[uVar17].count = uVar20;
  pUVar15 = pUVar12[uVar17].hh_head;
  (pcVar22->hh).hh_next = pUVar15;
  ((*channel)->hh).hh_prev = (UT_hash_handle *)0x0;
  if (pUVar15 != (UT_hash_handle *)0x0) {
    pUVar15->hh_prev = &(*channel)->hh;
  }
  pUVar12[uVar17].hh_head = &(*channel)->hh;
  if (pUVar12[uVar17].expand_mult * 10 + 10 <= uVar20) {
    pcVar22 = *channel;
    pUVar11 = (pcVar22->hh).tbl;
    if (pUVar11->noexpand == 0) {
      uVar17 = pUVar11->num_buckets;
      pUVar12 = (UT_hash_bucket *)calloc(1,(ulong)uVar17 << 5);
      if (pUVar12 == (UT_hash_bucket *)0x0) {
LAB_0010482e:
        exit(-1);
      }
      pUVar11->ideal_chain_maxlen =
           ((pUVar11->num_items >> ((char)pUVar11->log2_num_buckets + 1U & 0x1f)) + 1) -
           (uint)((uVar17 * 2 - 1 & pUVar11->num_items) == 0);
      pUVar11->nonideal_items = 0;
      if (uVar17 != 0) {
        uVar13 = 0;
        do {
          pUVar15 = pUVar11->buckets[uVar13].hh_head;
          if (pUVar15 != (UT_hash_handle *)0x0) {
            do {
              pUVar11 = ((*channel)->hh).tbl;
              uVar20 = pUVar11->num_buckets * 2 - 1 & pUVar15->hashv;
              pUVar4 = pUVar15->hh_next;
              pUVar1 = pUVar12 + uVar20;
              uVar17 = pUVar12[uVar20].count + 1;
              pUVar12[uVar20].count = uVar17;
              if (pUVar11->ideal_chain_maxlen < uVar17) {
                pUVar11->nonideal_items = pUVar11->nonideal_items + 1;
                if (pUVar11->ideal_chain_maxlen * pUVar1->expand_mult < uVar17) {
                  pUVar1->expand_mult = pUVar1->expand_mult + 1;
                }
              }
              pUVar15->hh_prev = (UT_hash_handle *)0x0;
              pUVar5 = pUVar1->hh_head;
              pUVar15->hh_next = pUVar5;
              if (pUVar5 != (UT_hash_handle *)0x0) {
                pUVar5->hh_prev = pUVar15;
              }
              pUVar1->hh_head = pUVar15;
              pUVar15 = pUVar4;
            } while (pUVar4 != (UT_hash_handle *)0x0);
            pcVar22 = *channel;
          }
          uVar13 = uVar13 + 1;
          pUVar11 = (pcVar22->hh).tbl;
        } while (uVar13 < pUVar11->num_buckets);
      }
      free(pUVar11->buckets);
      pUVar11 = ((*channel)->hh).tbl;
      pUVar11->num_buckets = pUVar11->num_buckets << 1;
      pUVar11->log2_num_buckets = pUVar11->log2_num_buckets + 1;
      pUVar11->buckets = pUVar12;
      pUVar11 = ((*channel)->hh).tbl;
      if (pUVar11->num_items >> 1 < pUVar11->nonideal_items) {
        uVar17 = pUVar11->ineff_expands + 1;
        pUVar11->ineff_expands = uVar17;
        if (1 < uVar17) {
          pUVar11->noexpand = 1;
        }
      }
      else {
        pUVar11->ineff_expands = 0;
      }
    }
  }
  return true;
}

Assistant:

bool chirc_ctx_get_or_create_channel(chirc_ctx_t *ctx, char *channelname, chirc_channel_t **channel)
{
    bool created;


    HASH_FIND_STR(ctx->channels, channelname, *channel);
    if(*channel)
    {
        created = false;
    }
    else
    {
        created = true;

        *channel = malloc(sizeof(chirc_channel_t));
        chirc_channel_init(*channel);
        (*channel)->name = sdsnew(channelname);
        HASH_ADD_KEYPTR(hh, ctx->channels, (*channel)->name, sdslen((*channel)->name), *channel);
    }

    return created;
}